

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis_enc.c
# Opt level: O3

int VP8EncAnalyze(VP8Encoder *enc)

{
  size_t __n;
  VP8MBInfo *pVVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  WebPWorkerInterface *pWVar7;
  long lVar8;
  void *ptr;
  int iVar9;
  int iVar10;
  int iVar11;
  byte bVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  VP8Encoder *pVVar25;
  int *piVar26;
  int w;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int centers [4];
  int dist_accum [4];
  int accum [4];
  SegmentJob side_job;
  ulong local_2740;
  ulong local_2738;
  int local_2730;
  uint local_272c [5];
  undefined1 local_2718 [16];
  VP8Encoder *local_2708;
  ulong local_2700;
  size_t local_26f8;
  ulong local_26f0;
  int local_26e8 [4];
  int local_26d8 [6];
  SegmentJob local_26c0;
  SegmentJob local_1378;
  
  if (((enc->config_->emulate_jpeg_size == 0) && ((enc->segment_hdr_).num_segments_ < 2)) &&
     (1 < enc->method_)) {
    if (0 < enc->mb_h_ * enc->mb_w_) {
      lVar8 = 0;
      do {
        pVVar1 = enc->mb_info_;
        *(byte *)(pVVar1 + lVar8) = (*(byte *)(pVVar1 + lVar8) & 0x80) + 1;
        pVVar1[lVar8].alpha_ = '\0';
        lVar8 = lVar8 + 1;
      } while (lVar8 < (long)enc->mb_h_ * (long)enc->mb_w_);
    }
    enc->dqm_[0].alpha_ = 0;
    enc->dqm_[0].beta_ = 0;
    enc->alpha_ = 0;
    enc->uv_alpha_ = 0;
    WebPReportProgress(enc->pic_,enc->percent_ + 0x14,&enc->percent_);
    return 1;
  }
  iVar22 = enc->mb_h_;
  iVar11 = enc->mb_w_ * iVar22;
  iVar24 = enc->thread_level_;
  pWVar7 = WebPGetWorkerInterface();
  local_2708 = enc;
  if ((iVar24 < 1) || (iVar24 = iVar22 * 9 + 0xf >> 4, iVar24 < 2)) {
    InitSegmentJob(enc,&local_26c0,0,iVar22);
    (*pWVar7->Execute)(&local_26c0.worker);
    local_272c[0] = (*pWVar7->Sync)(&local_26c0.worker);
    local_272c[0] = local_272c[0] & 1;
  }
  else {
    InitSegmentJob(enc,&local_26c0,0,iVar24);
    InitSegmentJob(enc,&local_1378,iVar24,iVar22);
    uVar3 = (*pWVar7->Reset)(&local_1378.worker);
    local_272c[0] = 0;
    if ((uVar3 & 1) == 0) {
      (*pWVar7->End)(&local_1378.worker);
      enc = local_2708;
    }
    else {
      (*pWVar7->Launch)(&local_1378.worker);
      (*pWVar7->Execute)(&local_26c0.worker);
      uVar3 = (*pWVar7->Sync)(&local_1378.worker);
      uVar4 = (*pWVar7->Sync)(&local_26c0.worker);
      (*pWVar7->End)(&local_1378.worker);
      uVar3 = uVar4 & uVar3 & 1;
      enc = local_2708;
      if (uVar3 != 0) {
        lVar8 = 0;
        do {
          iVar22 = local_1378.alphas[lVar8 + 1];
          iVar24 = local_1378.alphas[lVar8 + 2];
          iVar14 = local_1378.alphas[lVar8 + 3];
          iVar20 = local_26c0.alphas[lVar8 + 1];
          iVar9 = local_26c0.alphas[lVar8 + 2];
          iVar5 = local_26c0.alphas[lVar8 + 3];
          local_26c0.alphas[lVar8] = local_26c0.alphas[lVar8] + local_1378.alphas[lVar8];
          local_26c0.alphas[lVar8 + 1] = iVar20 + iVar22;
          local_26c0.alphas[lVar8 + 2] = iVar9 + iVar24;
          local_26c0.alphas[lVar8 + 3] = iVar5 + iVar14;
          lVar8 = lVar8 + 4;
        } while (lVar8 != 0x100);
        iVar22 = local_26c0.uv_alpha;
        local_26c0.alpha = local_26c0.alpha + local_1378.alpha;
        local_26c0.uv_alpha = iVar22 + local_1378.uv_alpha;
        local_272c[0] = uVar3;
      }
    }
  }
  (*pWVar7->End)(&local_26c0.worker);
  if (local_272c[0] == 0) {
    return 0;
  }
  enc->alpha_ = local_26c0.alpha / iVar11;
  enc->uv_alpha_ = local_26c0.uv_alpha / iVar11;
  uVar3 = (enc->segment_hdr_).num_segments_;
  uVar4 = 4;
  if ((int)uVar3 < 4) {
    uVar4 = uVar3;
  }
  uVar23 = 0;
  do {
    if (local_26c0.alphas[uVar23] != 0) {
      if (uVar23 < 0xff) {
        local_2740 = 0xff;
        goto LAB_00134371;
      }
      local_2740 = 0xff;
      goto LAB_001343a1;
    }
    uVar23 = uVar23 + 1;
  } while (uVar23 != 0x100);
  local_2740 = 0xff;
  uVar23 = 0x100;
  goto LAB_001343a1;
  while (local_2740 = local_2740 - 1, uVar23 < local_2740) {
LAB_00134371:
    if (local_26c0.alphas[local_2740] != 0) goto LAB_001343a1;
  }
  local_2740 = uVar23 & 0xffffffff;
LAB_001343a1:
  iVar22 = (int)uVar23;
  iVar24 = (int)local_2740;
  if (0 < (int)uVar3) {
    iVar11 = iVar24 - iVar22;
    lVar8 = (ulong)uVar4 - 1;
    auVar27._8_4_ = (int)lVar8;
    auVar27._0_8_ = lVar8;
    auVar27._12_4_ = (int)((ulong)lVar8 >> 0x20);
    iVar14 = iVar24 * 3 + iVar22 * -3;
    iVar20 = iVar24 * 4 + iVar22 * -4;
    uVar21 = 0;
    auVar27 = auVar27 ^ _DAT_00154f40;
    auVar28 = _DAT_00154d50;
    do {
      auVar29 = auVar28 ^ _DAT_00154f40;
      if ((bool)(~(auVar29._4_4_ == auVar27._4_4_ && auVar27._0_4_ < auVar29._0_4_ ||
                  auVar27._4_4_ < auVar29._4_4_) & 1)) {
        *(int *)((long)local_272c + uVar21 + 4) = iVar11 / (int)(uVar4 * 2) + iVar22;
      }
      if ((auVar29._12_4_ != auVar27._12_4_ || auVar29._8_4_ <= auVar27._8_4_) &&
          auVar29._12_4_ <= auVar27._12_4_) {
        *(int *)((long)local_272c + uVar21 + 8) = iVar14 / (int)(uVar4 * 2) + iVar22;
      }
      lVar8 = auVar28._8_8_;
      auVar28._0_8_ = auVar28._0_8_ + 2;
      auVar28._8_8_ = lVar8 + 2;
      uVar21 = uVar21 + 8;
      iVar14 = iVar14 + iVar20;
      iVar11 = iVar11 + iVar20;
    } while ((uVar4 * 4 + 4 & 0x38) != uVar21);
  }
  __n = (ulong)(uVar4 - 1) * 4 + 4;
  local_26f8 = __n;
  local_2700 = uVar23 & 0xffffffff;
  if (iVar22 < iVar24) {
    iVar22 = iVar24;
  }
  iVar11 = 0;
  local_26f0 = uVar23;
  do {
    if (0 < (int)uVar3) {
      memset(local_26d8,0,__n);
      memset(local_26e8,0,__n);
      uVar23 = local_26f0;
    }
    uVar13 = local_272c[0];
    if ((int)uVar23 <= iVar24) {
      iVar14 = 0;
      uVar21 = local_2700;
      do {
        iVar20 = local_26c0.alphas[uVar21];
        if (iVar20 != 0) {
          uVar6 = iVar14 + 1U;
          if ((int)(iVar14 + 1U) < (int)uVar4) {
            uVar6 = uVar4;
          }
          iVar9 = iVar14 + -1;
          lVar8 = (long)iVar14;
          do {
            lVar15 = lVar8 + 1;
            iVar5 = (int)uVar21;
            iVar14 = uVar6 - 1;
            if ((int)uVar4 <= lVar15) break;
            uVar17 = iVar5 - local_272c[lVar8 + 2];
            uVar2 = -uVar17;
            if (0 < (int)uVar17) {
              uVar2 = uVar17;
            }
            uVar18 = iVar5 - local_272c[lVar15];
            uVar17 = -uVar18;
            if (0 < (int)uVar18) {
              uVar17 = uVar18;
            }
            iVar9 = iVar9 + 1;
            lVar8 = lVar15;
            iVar14 = iVar9;
          } while (uVar2 < uVar17);
          local_26e8[iVar14] = local_26e8[iVar14] + iVar20 * iVar5;
          local_1378.alphas[uVar21 - 0xc] = iVar14;
          local_26d8[iVar14] = local_26d8[iVar14] + iVar20;
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 != iVar22 + 1);
    }
    if ((int)uVar3 < 1) goto LAB_001345ef;
    uVar16 = 0;
    iVar14 = 0;
    iVar20 = 0;
    uVar21 = 0;
    do {
      iVar9 = local_26d8[uVar16];
      if (iVar9 != 0) {
        uVar6 = (iVar9 / 2 + local_26e8[uVar16]) / iVar9;
        iVar10 = local_272c[uVar16 + 1] - uVar6;
        iVar5 = -iVar10;
        if (0 < iVar10) {
          iVar5 = iVar10;
        }
        iVar20 = iVar20 + iVar5;
        local_272c[uVar16 + 1] = uVar6;
        iVar14 = iVar14 + uVar6 * iVar9;
        uVar21 = (ulong)(uint)((int)uVar21 + iVar9);
      }
      uVar16 = uVar16 + 1;
    } while (uVar4 != uVar16);
  } while ((4 < iVar20) && (iVar11 = iVar11 + 1, iVar11 != 6));
  local_2730 = (iVar14 + ((int)(uVar21 >> 0x1f) + (int)uVar21 >> 1)) / (int)uVar21;
LAB_001345ef:
  pVVar25 = local_2708;
  uVar4 = local_2708->mb_w_;
  iVar22 = local_2708->mb_h_;
  iVar24 = iVar22 * uVar4;
  if (0 < iVar24) {
    lVar8 = 0;
    do {
      pVVar1 = local_2708->mb_info_;
      iVar22 = local_1378.alphas[(ulong)pVVar1[lVar8].alpha_ - 0xc];
      *(byte *)(pVVar1 + lVar8) = *(byte *)(pVVar1 + lVar8) & 0x9f | ((byte)iVar22 & 3) << 5;
      pVVar1[lVar8].alpha_ = (uint8_t)local_272c[(long)iVar22 + 1];
      lVar8 = lVar8 + 1;
      uVar4 = local_2708->mb_w_;
      iVar22 = local_2708->mb_h_;
      iVar24 = iVar22 * uVar4;
    } while (lVar8 < iVar24);
  }
  if (((1 < (int)uVar3) && ((local_2708->config_->preprocessing & 1) != 0)) &&
     (ptr = WebPSafeMalloc((long)iVar24,1), ptr != (void *)0x0)) {
    if (2 < iVar22) {
      uVar3 = uVar4 - 1;
      uVar23 = (ulong)uVar4;
      local_2738 = 1;
      do {
        if (2 < (int)uVar4) {
          uVar21 = 1;
          do {
            local_2718 = (undefined1  [16])0x0;
            lVar8 = uVar21 + local_2738 * uVar23;
            pVVar1 = pVVar25->mb_info_ + lVar8;
            bVar12 = *(byte *)pVVar1;
            *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)~uVar4) >> 3 & 0xc)) =
                 *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)~uVar4) >> 3 & 0xc)) + 1;
            *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)-uVar4) >> 3 & 0xc)) =
                 *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)-uVar4) >> 3 & 0xc)) + 1;
            *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)(1 - uVar4)) >> 3 & 0xc)) =
                 *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)(1 - uVar4)) >> 3 & 0xc)) + 1;
            *(int *)(local_2718 + (*(byte *)(pVVar1 + -1) >> 3 & 0xc)) =
                 *(int *)(local_2718 + (*(byte *)(pVVar1 + -1) >> 3 & 0xc)) + 1;
            *(int *)(local_2718 + (*(byte *)(pVVar1 + 1) >> 3 & 0xc)) =
                 *(int *)(local_2718 + (*(byte *)(pVVar1 + 1) >> 3 & 0xc)) + 1;
            *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)uVar3) >> 3 & 0xc)) =
                 *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)uVar3) >> 3 & 0xc)) + 1;
            *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)uVar4) >> 3 & 0xc)) =
                 *(int *)(local_2718 + (*(byte *)(pVVar1 + (int)uVar4) >> 3 & 0xc)) + 1;
            bVar12 = bVar12 >> 5 & 3;
            *(int *)(local_2718 + (*(byte *)(pVVar1 + (long)(int)uVar4 + 1) >> 3 & 0xc)) =
                 *(int *)(local_2718 + (*(byte *)(pVVar1 + (long)(int)uVar4 + 1) >> 3 & 0xc)) + 1;
            lVar15 = 0;
            do {
              if (4 < *(int *)(local_2718 + lVar15 * 4)) {
                bVar12 = (byte)lVar15;
                break;
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 != 4);
            *(byte *)((long)ptr + lVar8) = bVar12;
            uVar21 = uVar21 + 1;
            pVVar25 = local_2708;
          } while (uVar21 != uVar3);
        }
        local_2738 = local_2738 + 1;
      } while (local_2738 != iVar22 - 1);
      lVar8 = uVar23 + 1;
      uVar21 = 1;
      do {
        lVar15 = lVar8;
        lVar19 = (ulong)uVar3 - 1;
        if (2 < (int)uVar4) {
          do {
            *(byte *)(pVVar25->mb_info_ + lVar15) =
                 *(byte *)(pVVar25->mb_info_ + lVar15) & 0x9f |
                 (*(byte *)((long)ptr + lVar15) & 3) << 5;
            lVar19 = lVar19 + -1;
            lVar15 = lVar15 + 1;
          } while (lVar19 != 0);
        }
        uVar21 = uVar21 + 1;
        lVar8 = lVar8 + uVar23;
        uVar13 = local_272c[0];
      } while (uVar21 != iVar22 - 1);
    }
    WebPSafeFree(ptr);
  }
  iVar22 = (pVVar25->segment_hdr_).num_segments_;
  lVar8 = (long)iVar22;
  uVar3 = local_272c[1];
  if (1 < lVar8) {
    lVar15 = 0;
    do {
      uVar4 = local_272c[lVar15 + 1];
      if ((int)uVar4 <= (int)local_272c[1]) {
        local_272c[1] = uVar4;
      }
      if ((int)uVar3 <= (int)uVar4) {
        uVar3 = uVar4;
      }
      lVar15 = lVar15 + 1;
    } while (lVar8 != lVar15);
  }
  if (0 < iVar22) {
    uVar4 = local_272c[1] + 1;
    if (uVar3 != local_272c[1]) {
      uVar4 = uVar3;
    }
    piVar26 = &pVVar25->dqm_[0].beta_;
    lVar15 = 0;
    do {
      iVar22 = (int)((local_272c[lVar15 + 1] - local_2730) * 0xff) / (int)(uVar4 - local_272c[1]);
      iVar24 = (int)((local_272c[lVar15 + 1] - local_272c[1]) * 0xff) / (int)(uVar4 - local_272c[1])
      ;
      if (0x7e < iVar22) {
        iVar22 = 0x7f;
      }
      if (iVar22 < -0x7e) {
        iVar22 = -0x7f;
      }
      piVar26[-1] = iVar22;
      if (0xfe < iVar24) {
        iVar24 = 0xff;
      }
      if (iVar24 < 1) {
        iVar24 = 0;
      }
      *piVar26 = iVar24;
      lVar15 = lVar15 + 1;
      piVar26 = piVar26 + 0xba;
    } while (lVar8 != lVar15);
  }
  return uVar13;
}

Assistant:

int VP8EncAnalyze(VP8Encoder* const enc) {
  int ok = 1;
  const int do_segments =
      enc->config_->emulate_jpeg_size ||   // We need the complexity evaluation.
      (enc->segment_hdr_.num_segments_ > 1) ||
      (enc->method_ <= 1);  // for method 0 - 1, we need preds_[] to be filled.
  if (do_segments) {
    const int last_row = enc->mb_h_;
    // We give a little more than a half work to the main thread.
    const int split_row = (9 * last_row + 15) >> 4;
    const int total_mb = last_row * enc->mb_w_;
#ifdef WEBP_USE_THREAD
    const int kMinSplitRow = 2;  // minimal rows needed for mt to be worth it
    const int do_mt = (enc->thread_level_ > 0) && (split_row >= kMinSplitRow);
#else
    const int do_mt = 0;
#endif
    const WebPWorkerInterface* const worker_interface =
        WebPGetWorkerInterface();
    SegmentJob main_job;
    if (do_mt) {
      SegmentJob side_job;
      // Note the use of '&' instead of '&&' because we must call the functions
      // no matter what.
      InitSegmentJob(enc, &main_job, 0, split_row);
      InitSegmentJob(enc, &side_job, split_row, last_row);
      // we don't need to call Reset() on main_job.worker, since we're calling
      // WebPWorkerExecute() on it
      ok &= worker_interface->Reset(&side_job.worker);
      // launch the two jobs in parallel
      if (ok) {
        worker_interface->Launch(&side_job.worker);
        worker_interface->Execute(&main_job.worker);
        ok &= worker_interface->Sync(&side_job.worker);
        ok &= worker_interface->Sync(&main_job.worker);
      }
      worker_interface->End(&side_job.worker);
      if (ok) MergeJobs(&side_job, &main_job);  // merge results together
    } else {
      // Even for single-thread case, we use the generic Worker tools.
      InitSegmentJob(enc, &main_job, 0, last_row);
      worker_interface->Execute(&main_job.worker);
      ok &= worker_interface->Sync(&main_job.worker);
    }
    worker_interface->End(&main_job.worker);
    if (ok) {
      enc->alpha_ = main_job.alpha / total_mb;
      enc->uv_alpha_ = main_job.uv_alpha / total_mb;
      AssignSegments(enc, main_job.alphas);
    }
  } else {   // Use only one default segment.
    ResetAllMBInfo(enc);
  }
  return ok;
}